

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::ProxyClient::SetMeshLocalPrefix
          (Error *__return_storage_ptr__,ProxyClient *this,ByteArray *aMeshLocalPrefix)

{
  bool bVar1;
  size_type sVar2;
  ProxyClient *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  anon_class_1_0_00000001 local_26a;
  v10 local_269;
  v10 *local_268;
  size_t local_260;
  string local_258;
  Error local_238;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_210;
  uchar *local_208;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_200;
  anon_class_1_0_00000001 local_1e2;
  v10 local_1e1;
  v10 *local_1e0;
  char *local_1d8;
  string local_1d0;
  Error local_1b0;
  undefined1 local_182;
  uchar local_181;
  ByteArray *pBStack_180;
  uint8_t meshLocalPrefix [1];
  ByteArray *aMeshLocalPrefix_local;
  ProxyClient *this_local;
  Error *error;
  undefined1 local_150 [16];
  v10 *local_140;
  ulong local_138;
  v10 *local_130;
  size_t sStack_128;
  string *local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  *local_118 [3];
  undefined1 local_100 [16];
  v10 *local_f0;
  char *local_e8;
  undefined8 *local_e0;
  v10 *local_d8;
  char *pcStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  Error **local_80;
  undefined1 *local_78;
  Error **local_70;
  Error **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  **local_10;
  
  local_181 = 0xfd;
  local_182 = 0;
  this_00 = this;
  pBStack_180 = aMeshLocalPrefix;
  Error::Error(__return_storage_ptr__);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pBStack_180);
  if (sVar2 == 8) {
    local_200._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pBStack_180);
    local_210._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pBStack_180);
    local_208 = (uchar *)__gnu_cxx::
                         __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&local_210,1);
    bVar1 = std::
            equal<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*>
                      (local_200,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_208,&local_181);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this->mMeshLocalPrefix,pBStack_180);
    }
    else {
      SetMeshLocalPrefix::anon_class_1_0_00000001::operator()(&local_26a);
      local_a8 = &local_268;
      local_b0 = &local_269;
      bVar3 = ::fmt::v10::operator()(local_b0);
      local_260 = bVar3.size_;
      local_268 = (v10 *)bVar3.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_120 = &local_258;
      local_130 = local_268;
      sStack_128 = local_260;
      local_a0 = &local_130;
      local_140 = local_268;
      local_138 = local_260;
      local_98 = local_140;
      sStack_90 = local_138;
      error = (Error *)::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_78 = local_150;
      local_80 = &error;
      local_60 = 0;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_80;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_138;
      local_70 = local_80;
      local_68 = local_80;
      local_58 = local_78;
      ::fmt::v10::vformat_abi_cxx11_(&local_258,local_140,fmt_00,args_00);
      Error::Error(&local_238,kInvalidArgs,&local_258);
      Error::operator=(__return_storage_ptr__,&local_238);
      Error::~Error(&local_238);
      std::__cxx11::string::~string((string *)&local_258);
    }
  }
  else {
    SetMeshLocalPrefix::anon_class_1_0_00000001::operator()(&local_1e2);
    local_b8 = &local_1e0;
    local_c0 = &local_1e1;
    bVar3 = ::fmt::v10::operator()(local_c0);
    local_1d8 = (char *)bVar3.size_;
    local_1e0 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::check_format_string<const_unsigned_long_&,_FMT_COMPILE_STRING,_0>();
    local_c8 = &local_1d0;
    local_d8 = local_1e0;
    pcStack_d0 = local_1d8;
    local_e0 = &kMeshLocalPrefixLength;
    local_50 = &local_d8;
    local_f0 = local_1e0;
    local_e8 = local_1d8;
    local_48 = local_f0;
    pcStack_40 = local_e8;
    local_118[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_long_const>
                             ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
                               *)&kMeshLocalPrefixLength,(v10 *)this_00,(unsigned_long *)local_c8);
    local_30 = local_100;
    local_38 = local_118;
    local_20 = 4;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 4;
    fmt.data_ = local_e8;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_1d0,local_f0,fmt,args);
    Error::Error(&local_1b0,kInvalidArgs,&local_1d0);
    Error::operator=(__return_storage_ptr__,&local_1b0);
    Error::~Error(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error ProxyClient::SetMeshLocalPrefix(const ByteArray &aMeshLocalPrefix)
{
    constexpr uint8_t meshLocalPrefix[] = {0xfd};
    Error             error;

    VerifyOrExit(aMeshLocalPrefix.size() == kMeshLocalPrefixLength,
                 error = ERROR_INVALID_ARGS("Thread Mesh-Local Prefix length must be {}", kMeshLocalPrefixLength));
    VerifyOrExit(
        std::equal(aMeshLocalPrefix.begin(), aMeshLocalPrefix.begin() + sizeof(meshLocalPrefix), meshLocalPrefix),
        error = ERROR_INVALID_ARGS("Thread Mesh-Local Prefix must start with fd00::/8"));

    mMeshLocalPrefix = aMeshLocalPrefix;

exit:
    return error;
}